

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

_Bool check_buffer_below_thresh(AV1_COMP *cpi,int64_t buffer_level,int drop_mark)

{
  LAYER_CONTEXT *pLVar1;
  int iVar2;
  int drop_mark_layer;
  int drop_thresh;
  PRIMARY_RATE_CONTROL *lrc;
  LAYER_CONTEXT *lc;
  int layer;
  int i;
  SVC *svc;
  int drop_mark_local;
  int64_t buffer_level_local;
  AV1_COMP *cpi_local;
  bool local_1;
  
  if (((cpi->ppi->use_svc == 0) || ((cpi->svc).number_spatial_layers == 1)) ||
     ((cpi->svc).framedrop_mode == AOM_LAYER_DROP)) {
    local_1 = buffer_level <= drop_mark;
  }
  else {
    for (i = (cpi->svc).spatial_layer_id; i < (cpi->svc).number_spatial_layers; i = i + 1) {
      iVar2 = i * (cpi->svc).number_temporal_layers + (cpi->svc).temporal_layer_id;
      pLVar1 = (cpi->svc).layer_context;
      if ((0 < pLVar1[iVar2].target_bandwidth) &&
         (pLVar1[iVar2].p_rc.buffer_level <=
          (long)(int)(((long)(cpi->oxcf).rc_cfg.drop_frames_water_mark *
                      pLVar1[iVar2].p_rc.optimal_buffer_level) / 100))) {
        return true;
      }
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool check_buffer_below_thresh(AV1_COMP *cpi, int64_t buffer_level,
                                      int drop_mark) {
  SVC *svc = &cpi->svc;
  if (!cpi->ppi->use_svc || cpi->svc.number_spatial_layers == 1 ||
      cpi->svc.framedrop_mode == AOM_LAYER_DROP) {
    return (buffer_level <= drop_mark);
  } else {
    // For SVC in the AOM_FULL_SUPERFRAME_DROP): the condition on
    // buffer is checked on current and upper spatial layers.
    for (int i = svc->spatial_layer_id; i < svc->number_spatial_layers; ++i) {
      const int layer = LAYER_IDS_TO_IDX(i, svc->temporal_layer_id,
                                         svc->number_temporal_layers);
      LAYER_CONTEXT *lc = &svc->layer_context[layer];
      PRIMARY_RATE_CONTROL *lrc = &lc->p_rc;
      // Exclude check for layer whose bitrate is 0.
      if (lc->target_bandwidth > 0) {
        const int drop_thresh = cpi->oxcf.rc_cfg.drop_frames_water_mark;
        const int drop_mark_layer =
            (int)(drop_thresh * lrc->optimal_buffer_level / 100);
        if (lrc->buffer_level <= drop_mark_layer) return true;
      }
    }
    return false;
  }
}